

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

void add_label_addr(compiler_common *common,sljit_uw *update_addr)

{
  sljit_compiler *compiler_00;
  label_addr_list *plVar1;
  sljit_label *psVar2;
  label_addr_list *label_addr;
  sljit_compiler *compiler;
  sljit_uw *update_addr_local;
  compiler_common *common_local;
  
  compiler_00 = common->compiler;
  plVar1 = (label_addr_list *)sljit_alloc_memory(compiler_00,0x18);
  if (plVar1 != (label_addr_list *)0x0) {
    psVar2 = sljit_emit_label(compiler_00);
    plVar1->label = psVar2;
    plVar1->update_addr = update_addr;
    plVar1->next = common->label_addrs;
    common->label_addrs = plVar1;
  }
  return;
}

Assistant:

static void add_label_addr(compiler_common *common, sljit_uw *update_addr)
{
DEFINE_COMPILER;
label_addr_list *label_addr;

label_addr = sljit_alloc_memory(compiler, sizeof(label_addr_list));
if (label_addr == NULL)
  return;
label_addr->label = LABEL();
label_addr->update_addr = update_addr;
label_addr->next = common->label_addrs;
common->label_addrs = label_addr;
}